

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_custom_aggregator.cpp
# Opt level: O1

void __thiscall
duckdb::WindowCustomAggregatorState::~WindowCustomAggregatorState(WindowCustomAggregatorState *this)

{
  ~WindowCustomAggregatorState(this);
  operator_delete(this);
  return;
}

Assistant:

WindowCustomAggregatorState::~WindowCustomAggregatorState() {
	if (aggr.function.destructor) {
		AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
		aggr.function.destructor(statef, aggr_input_data, 1);
	}
}